

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O1

LLVMValueRef CompileLlvmZeroInitialize(LlvmCompilationContext *ctx,ExprZeroInitialize *node)

{
  TypeBase *pTVar1;
  
  pTVar1 = node->address->type;
  if ((pTVar1 == (TypeBase *)0x0) || (pTVar1->typeID != 0x12)) {
    pTVar1 = (TypeBase *)0x0;
  }
  if (pTVar1 != (TypeBase *)0x0) {
    CompileLlvm(ctx,node->address);
    CompileLlvmType(ctx,(TypeBase *)pTVar1[1]._vptr_TypeBase);
    if ((node->super_ExprBase).type == ctx->ctx->typeVoid) {
      return (LLVMValueRef)0x0;
    }
    __assert_fail("node->type == ctx.ctx.typeVoid",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeLlvm.cpp"
                  ,0x27b,
                  "LLVMValueRef CheckType(LlvmCompilationContext &, ExprBase *, LLVMValueRef)");
  }
  __assert_fail("refType",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeLlvm.cpp"
                ,0x61f,
                "LLVMValueRef CompileLlvmZeroInitialize(LlvmCompilationContext &, ExprZeroInitialize *)"
               );
}

Assistant:

LLVMValueRef CompileLlvmZeroInitialize(LlvmCompilationContext &ctx, ExprZeroInitialize *node)
{
	TypeRef *refType = getType<TypeRef>(node->address->type);

	assert(refType);

	LLVMValueRef address = CompileLlvm(ctx, node->address);

	LLVMBuildStore(ctx.builder, LLVMConstNull(CompileLlvmType(ctx, refType->subType)), address);

	return CheckType(ctx, node, NULL);
}